

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O1

void __thiscall
VW::object_pool<example,_example_initializer>::object_pool
          (object_pool<example,_example_initializer> *this,size_t initial_chunk_size,size_t param_3)

{
  (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  *(undefined8 *)((long)&(this->m_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<example_*,_std::allocator<example_*>_>::_M_initialize_map
            ((_Deque_base<example_*,_std::allocator<example_*>_> *)&this->m_pool,0);
  (this->m_chunks).
  super__Vector_base<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_chunks).
  super__Vector_base<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_chunk_bounds).
  super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_chunks).
  super__Vector_base<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_chunk_bounds).
  super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_chunk_bounds).
  super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_initial_chunk_size = initial_chunk_size;
  this->m_chunk_size = param_3;
  new_chunk(this,initial_chunk_size);
  return;
}

Assistant:

object_pool(size_t initial_chunk_size, TInitializer initializer = {}, size_t chunk_size = 8)
    : m_initializer(initializer),
    m_initial_chunk_size(initial_chunk_size),
    m_chunk_size(chunk_size)
  {
    new_chunk(initial_chunk_size);
  }